

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_hexlineedit.cpp
# Opt level: O2

void HexLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == WriteProperty) {
    if (_id == 0) {
      _o[0x28] = *(QObject *)*_a;
      return;
    }
  }
  else if ((_c == ReadProperty) && (_id == 0)) {
    *(QObject *)*_a = _o[0x28];
    return;
  }
  return;
}

Assistant:

void HexLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<HexLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->editAsGuid(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<HexLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEditAsGuid(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}